

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O0

void __thiscall
r_code::list<core::P<r_exec::_Fact>_>::push_back_free_cell
          (list<core::P<r_exec::_Fact>_> *this,P<r_exec::_Fact> *t)

{
  size_type __n;
  int64_t iVar1;
  reference pvVar2;
  int64_t free;
  P<r_exec::_Fact> *t_local;
  list<core::P<r_exec::_Fact>_> *this_local;
  
  __n = this->free_cells;
  pvVar2 = std::
           vector<r_code::list<core::P<r_exec::_Fact>_>::cell,_std::allocator<r_code::list<core::P<r_exec::_Fact>_>::cell>_>
           ::operator[](&this->cells,this->free_cells);
  this->free_cells = pvVar2->next;
  this->free_cell_count = this->free_cell_count - 1;
  pvVar2 = std::
           vector<r_code::list<core::P<r_exec::_Fact>_>::cell,_std::allocator<r_code::list<core::P<r_exec::_Fact>_>::cell>_>
           ::operator[](&this->cells,__n);
  core::P<r_exec::_Fact>::operator=(&pvVar2->data,t);
  pvVar2 = std::
           vector<r_code::list<core::P<r_exec::_Fact>_>::cell,_std::allocator<r_code::list<core::P<r_exec::_Fact>_>::cell>_>
           ::operator[](&this->cells,__n);
  pvVar2->next = -1;
  iVar1 = this->used_cells_tail;
  pvVar2 = std::
           vector<r_code::list<core::P<r_exec::_Fact>_>::cell,_std::allocator<r_code::list<core::P<r_exec::_Fact>_>::cell>_>
           ::operator[](&this->cells,__n);
  pvVar2->prev = iVar1;
  this->used_cells_tail = __n;
  return;
}

Assistant:

void push_back_free_cell(const T &t)
    {
        int64_t free = free_cells;
        free_cells = cells[free_cells].next;
        --free_cell_count;
        cells[free].data = t;
        cells[free].next = null;
        cells[free].prev = used_cells_tail;
        used_cells_tail = free;
    }